

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O1

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::collectBreakpointsMax
          (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int *nBp,int *minIdx,int *idx,int nnz,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upp,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *low,BreakpointSource src)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  pointer pBVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  cpp_dec_float<50U,_int,_void> *this_00;
  bool bVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_238;
  int *local_200;
  cpp_dec_float<50U,_int,_void> local_1f8;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> local_178;
  cpp_dec_float<50U,_int,_void> local_138;
  int *local_f8;
  cpp_dec_float<50U,_int,_void> *local_f0;
  cpp_dec_float<50U,_int,_void> local_e8;
  Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
  *local_a8;
  int *local_a0;
  cpp_dec_float<50U,_int,_void> local_98;
  undefined4 local_58;
  uint uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double local_48;
  undefined8 uStack_40;
  
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems[6] = 0;
  local_178.data._M_elems[7] = 0;
  local_178.data._M_elems._32_5_ = 0;
  local_178.data._M_elems[9]._1_3_ = 0;
  local_178.exp = 0;
  local_178.neg = false;
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 10;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems._24_5_ = 0;
  local_1b8.data._M_elems[7]._1_3_ = 0;
  local_1b8.data._M_elems._32_5_ = 0;
  local_1b8.data._M_elems[9]._1_3_ = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  local_200 = nBp;
  local_f8 = minIdx;
  if (*nBp == 0) {
    ::soplex::infinity::__tls_init();
    pdVar8 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_238.fpclass = cpp_dec_float_finite;
    local_238.prec_elem = 10;
    local_238.data._M_elems[0] = 0;
    local_238.data._M_elems[1] = 0;
    local_238.data._M_elems[2] = 0;
    local_238.data._M_elems[3] = 0;
    local_238.data._M_elems[4] = 0;
    local_238.data._M_elems[5] = 0;
    local_238.data._M_elems[6] = 0;
    local_238.data._M_elems[7] = 0;
    local_238.data._M_elems._32_5_ = 0;
    local_238.data._M_elems[9]._1_3_ = 0;
    local_238.exp = 0;
    local_238.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_238,*pdVar8);
  }
  else {
    iVar7 = *minIdx;
    pBVar3 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = *(undefined8 *)((long)&pBVar3[iVar7].val.m_backend + 0x20);
    local_238.data._M_elems._32_5_ = SUB85(uVar4,0);
    local_238.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_238.data._M_elems._0_8_ = *(undefined8 *)&pBVar3[iVar7].val.m_backend;
    local_238.data._M_elems._8_8_ = *(undefined8 *)((long)&pBVar3[iVar7].val.m_backend + 8);
    puVar2 = (uint *)((long)&pBVar3[iVar7].val.m_backend + 0x10);
    uVar4 = *(undefined8 *)puVar2;
    uVar5 = *(undefined8 *)(puVar2 + 2);
    local_238.data._M_elems[4] = (uint)uVar4;
    local_238.data._M_elems[5] = (uint)((ulong)uVar4 >> 0x20);
    local_238.data._M_elems[6] = (uint)uVar5;
    local_238.data._M_elems[7] = (uint)((ulong)uVar5 >> 0x20);
    local_238.exp = *(int *)((long)&pBVar3[iVar7].val.m_backend + 0x28);
    local_238.neg = *(bool *)((long)&pBVar3[iVar7].val.m_backend + 0x2c);
    local_238._48_8_ = *(undefined8 *)((long)&pBVar3[iVar7].val.m_backend + 0x30);
  }
  local_178.data._M_elems._32_5_ = local_238.data._M_elems._32_5_;
  local_178.data._M_elems[9]._1_3_ = local_238.data._M_elems[9]._1_3_;
  local_178.data._M_elems[5] = local_238.data._M_elems[5];
  local_178.data._M_elems[4] = local_238.data._M_elems[4];
  local_178.data._M_elems[6] = local_238.data._M_elems[6];
  local_178.data._M_elems[7] = local_238.data._M_elems[7];
  local_178.data._M_elems[0] = local_238.data._M_elems[0];
  local_178.data._M_elems[1] = local_238.data._M_elems[1];
  local_178.data._M_elems[2] = local_238.data._M_elems[2];
  local_178.data._M_elems[3] = local_238.data._M_elems[3];
  local_178.exp = local_238.exp;
  local_178.neg = local_238.neg;
  local_178.fpclass = local_238.fpclass;
  local_178.prec_elem = local_238.prec_elem;
  if (0 < nnz) {
    local_a0 = idx + nnz;
    pnVar1 = &(this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).epsilon;
    pdVar8 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_48 = *pdVar8;
    local_f0 = &(this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).fastDelta.m_backend;
    uStack_40 = 0;
    local_58 = SUB84(local_48,0);
    uStack_54 = (uint)((ulong)local_48 >> 0x20) ^ 0x80000000;
    uStack_50 = 0;
    uStack_4c = 0x80000000;
    local_a8 = &this->breakpoints;
    do {
      iVar7 = *idx;
      local_98.data._M_elems._32_8_ = *(undefined8 *)(upd[iVar7].m_backend.data._M_elems + 8);
      local_98.data._M_elems._0_8_ = *(undefined8 *)upd[iVar7].m_backend.data._M_elems;
      local_98.data._M_elems._8_8_ = *(undefined8 *)(upd[iVar7].m_backend.data._M_elems + 2);
      puVar2 = upd[iVar7].m_backend.data._M_elems + 4;
      local_98.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_98.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_98.exp = upd[iVar7].m_backend.exp;
      local_98.neg = upd[iVar7].m_backend.neg;
      local_98.fpclass = upd[iVar7].m_backend.fpclass;
      local_98.prec_elem = upd[iVar7].m_backend.prec_elem;
      uVar4 = *(undefined8 *)
               ((this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).epsilon.m_backend.data._M_elems + 8);
      local_238.data._M_elems._32_5_ = SUB85(uVar4,0);
      local_238.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_238.data._M_elems._0_16_ = *(undefined1 (*) [16])(pnVar1->m_backend).data._M_elems;
      uVar4 = *(undefined8 *)
               ((this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).epsilon.m_backend.data._M_elems + 4);
      uVar5 = *(undefined8 *)
               ((this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).epsilon.m_backend.data._M_elems + 6);
      local_238.data._M_elems[4] = (uint)uVar4;
      local_238.data._M_elems[5] = (uint)((ulong)uVar4 >> 0x20);
      local_238.data._M_elems[6] = (uint)uVar5;
      local_238.data._M_elems[7] = (uint)((ulong)uVar5 >> 0x20);
      local_238.exp =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.exp;
      local_238.neg =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.neg;
      local_238.fpclass =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.fpclass;
      local_238.prec_elem =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.prec_elem;
      if ((local_238.fpclass == cpp_dec_float_NaN || local_98.fpclass == cpp_dec_float_NaN) ||
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_98,&local_238), iVar6 < 1)) {
        uVar4 = *(undefined8 *)
                 ((this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).epsilon.m_backend.data._M_elems + 8);
        local_238.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_238.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_238.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
        local_238.data._M_elems._8_8_ =
             *(undefined8 *)
              ((this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.data._M_elems + 2);
        uVar4 = *(undefined8 *)
                 ((this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).epsilon.m_backend.data._M_elems + 4);
        uVar5 = *(undefined8 *)
                 ((this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).epsilon.m_backend.data._M_elems + 6);
        local_238.data._M_elems[4] = (uint)uVar4;
        local_238.data._M_elems[5] = (uint)((ulong)uVar4 >> 0x20);
        local_238.data._M_elems[6] = (uint)uVar5;
        local_238.data._M_elems[7] = (uint)((ulong)uVar5 >> 0x20);
        local_238.exp =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.exp;
        local_238.neg =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.neg;
        local_238.fpclass =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.fpclass;
        local_238.prec_elem =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.prec_elem;
        if (local_238.data._M_elems[0] != 0 || local_238.fpclass != cpp_dec_float_finite) {
          local_238.neg = (bool)(local_238.neg ^ 1);
        }
        if (((local_238.fpclass != cpp_dec_float_NaN) && (local_98.fpclass != cpp_dec_float_NaN)) &&
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_98,&local_238), iVar6 < 0)) {
          ::soplex::infinity::__tls_init();
          pcVar9 = &low[iVar7].m_backend;
          local_238.fpclass = cpp_dec_float_finite;
          local_238.prec_elem = 10;
          local_238.data._M_elems[0] = 0;
          local_238.data._M_elems[1] = 0;
          local_238.data._M_elems[2] = 0;
          local_238.data._M_elems[3] = 0;
          local_238.data._M_elems[4] = 0;
          local_238.data._M_elems[5] = 0;
          local_238.data._M_elems[6] = 0;
          local_238.data._M_elems[7] = 0;
          local_238.data._M_elems._32_5_ = 0;
          local_238.data._M_elems[9]._1_3_ = 0;
          local_238.exp = 0;
          local_238.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_238,(double)CONCAT44(uStack_54,local_58))
          ;
          if (((pcVar9->fpclass != cpp_dec_float_NaN) && (local_238.fpclass != cpp_dec_float_NaN))
             && (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar9,&local_238), 0 < iVar6)) {
            local_1f8.fpclass = cpp_dec_float_finite;
            local_1f8.prec_elem = 10;
            local_1f8.data._M_elems[0] = 0;
            local_1f8.data._M_elems[1] = 0;
            local_1f8.data._M_elems[2] = 0;
            local_1f8.data._M_elems[3] = 0;
            local_1f8.data._M_elems[4] = 0;
            local_1f8.data._M_elems[5] = 0;
            local_1f8.data._M_elems._24_5_ = 0;
            local_1f8.data._M_elems[7]._1_3_ = 0;
            local_1f8.data._M_elems._32_5_ = 0;
            local_1f8.data._M_elems[9]._1_3_ = 0;
            local_1f8.exp = 0;
            local_1f8.neg = false;
            if (&local_1f8 == &vec[iVar7].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1f8,pcVar9);
              if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
                local_1f8.neg = (bool)(local_1f8.neg ^ 1);
              }
            }
            else {
              if (&local_1f8 != pcVar9) {
                uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
                local_1f8.data._M_elems._32_5_ = SUB85(uVar4,0);
                local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
                local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
                local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
                local_1f8.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_1f8.exp = pcVar9->exp;
                local_1f8.neg = pcVar9->neg;
                local_1f8.fpclass = pcVar9->fpclass;
                local_1f8.prec_elem = pcVar9->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1f8,&vec[iVar7].m_backend);
            }
            pcVar9 = local_f0;
            if (local_1f8.fpclass != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_238,0,(type *)0x0);
              iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_1f8,&local_238);
              if (-1 < iVar6) {
                uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
                local_138.data._M_elems._32_5_ = SUB85(uVar4,0);
                local_138.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_138.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
                local_138.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
                local_138.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
                local_138.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_138.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_138.exp =
                     (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).fastDelta.m_backend.exp;
                local_138.neg =
                     (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).fastDelta.m_backend.neg;
                local_138.fpclass =
                     (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).fastDelta.m_backend.fpclass;
                local_138.prec_elem =
                     (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).fastDelta.m_backend.prec_elem;
                this_00 = &local_138;
                if (local_138.fpclass != cpp_dec_float_finite || local_138.data._M_elems[0] != 0) {
                  local_138.neg = (bool)(local_138.neg ^ 1);
                }
                goto LAB_002e353e;
              }
            }
            local_e8.fpclass = cpp_dec_float_finite;
            local_e8.prec_elem = 10;
            local_e8.data._M_elems[0] = 0;
            local_e8.data._M_elems[1] = 0;
            local_e8.data._M_elems[2] = 0;
            local_e8.data._M_elems[3] = 0;
            local_e8.data._M_elems[4] = 0;
            local_e8.data._M_elems[5] = 0;
            local_e8.data._M_elems._24_5_ = 0;
            local_e8.data._M_elems[7]._1_3_ = 0;
            local_e8.data._M_elems._32_5_ = 0;
            local_e8.data._M_elems[9]._1_3_ = 0;
            local_e8.exp = 0;
            local_e8.neg = false;
            this_00 = &local_e8;
            if (this_00 == pcVar9) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (this_00,&local_1f8);
              if (local_e8.data._M_elems[0] != 0 || local_e8.fpclass != cpp_dec_float_finite) {
                local_e8.neg = (bool)(local_e8.neg ^ 1);
                this_00 = &local_e8;
              }
            }
            else {
              local_e8.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
              local_e8.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
              local_e8.data._M_elems[4] = local_1f8.data._M_elems[4];
              local_e8.data._M_elems[5] = local_1f8.data._M_elems[5];
              local_e8.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
              local_e8.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
              local_e8.data._M_elems[0] = local_1f8.data._M_elems[0];
              local_e8.data._M_elems[1] = local_1f8.data._M_elems[1];
              local_e8.data._M_elems[2] = local_1f8.data._M_elems[2];
              local_e8.data._M_elems[3] = local_1f8.data._M_elems[3];
              local_e8.exp = local_1f8.exp;
              local_e8.neg = local_1f8.neg;
              local_e8.fpclass = local_1f8.fpclass;
              local_e8.prec_elem = local_1f8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (this_00,pcVar9);
            }
            goto LAB_002e353e;
          }
        }
      }
      else {
        ::soplex::infinity::__tls_init();
        pcVar9 = &upp[iVar7].m_backend;
        local_238.fpclass = cpp_dec_float_finite;
        local_238.prec_elem = 10;
        local_238.data._M_elems[0] = 0;
        local_238.data._M_elems[1] = 0;
        local_238.data._M_elems[2] = 0;
        local_238.data._M_elems[3] = 0;
        local_238.data._M_elems[4] = 0;
        local_238.data._M_elems[5] = 0;
        local_238.data._M_elems[6] = 0;
        local_238.data._M_elems[7] = 0;
        local_238.data._M_elems._32_5_ = 0;
        local_238.data._M_elems[9]._1_3_ = 0;
        local_238.exp = 0;
        local_238.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_238,local_48);
        if (((pcVar9->fpclass != cpp_dec_float_NaN) && (local_238.fpclass != cpp_dec_float_NaN)) &&
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar9,&local_238), iVar6 < 0)) {
          local_1f8.fpclass = cpp_dec_float_finite;
          local_1f8.prec_elem = 10;
          local_1f8.data._M_elems[0] = 0;
          local_1f8.data._M_elems[1] = 0;
          local_1f8.data._M_elems[2] = 0;
          local_1f8.data._M_elems[3] = 0;
          local_1f8.data._M_elems[4] = 0;
          local_1f8.data._M_elems[5] = 0;
          local_1f8.data._M_elems._24_5_ = 0;
          local_1f8.data._M_elems[7]._1_3_ = 0;
          local_1f8.data._M_elems._32_5_ = 0;
          local_1f8.data._M_elems[9]._1_3_ = 0;
          local_1f8.exp = 0;
          local_1f8.neg = false;
          if (&local_1f8 == &vec[iVar7].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_1f8,pcVar9);
            if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
              local_1f8.neg = (bool)(local_1f8.neg ^ 1);
            }
          }
          else {
            if (&local_1f8 != pcVar9) {
              uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
              local_1f8.data._M_elems._32_5_ = SUB85(uVar4,0);
              local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
              local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
              local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
              uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
              local_1f8.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_1f8.exp = pcVar9->exp;
              local_1f8.neg = pcVar9->neg;
              local_1f8.fpclass = pcVar9->fpclass;
              local_1f8.prec_elem = pcVar9->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_1f8,&vec[iVar7].m_backend);
          }
          this_00 = local_f0;
          if (local_1f8.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_238,0,(type *)0x0);
            iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_1f8,&local_238);
            if (iVar6 < 1) goto LAB_002e353e;
          }
          local_138.fpclass = cpp_dec_float_finite;
          local_138.prec_elem = 10;
          local_138.data._M_elems[0] = 0;
          local_138.data._M_elems[1] = 0;
          local_138.data._M_elems[2] = 0;
          local_138.data._M_elems[3] = 0;
          local_138.data._M_elems[4] = 0;
          local_138.data._M_elems[5] = 0;
          local_138.data._M_elems._24_5_ = 0;
          local_138.data._M_elems[7]._1_3_ = 0;
          local_138.data._M_elems._32_5_ = 0;
          local_138.data._M_elems[9]._1_3_ = 0;
          local_138.exp = 0;
          local_138.neg = false;
          pcVar9 = &local_1f8;
          if (&local_138 != this_00) {
            local_138.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
            local_138.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
            local_138.data._M_elems[4] = local_1f8.data._M_elems[4];
            local_138.data._M_elems[5] = local_1f8.data._M_elems[5];
            local_138.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
            local_138.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
            local_138.data._M_elems[0] = local_1f8.data._M_elems[0];
            local_138.data._M_elems[1] = local_1f8.data._M_elems[1];
            local_138.data._M_elems[2] = local_1f8.data._M_elems[2];
            local_138.data._M_elems[3] = local_1f8.data._M_elems[3];
            local_138.exp = local_1f8.exp;
            local_138.neg = local_1f8.neg;
            local_138.fpclass = local_1f8.fpclass;
            local_138.prec_elem = local_1f8.prec_elem;
            pcVar9 = this_00;
          }
          this_00 = &local_138;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(this_00,pcVar9)
          ;
LAB_002e353e:
          local_238.fpclass = cpp_dec_float_finite;
          local_238.prec_elem = 10;
          local_238.data._M_elems[0] = 0;
          local_238.data._M_elems[1] = 0;
          local_238.data._M_elems[2] = 0;
          local_238.data._M_elems[3] = 0;
          local_238.data._M_elems[4] = 0;
          local_238.data._M_elems[5] = 0;
          local_238.data._M_elems[6] = 0;
          local_238.data._M_elems[7] = 0;
          local_238.data._M_elems._32_5_ = 0;
          local_238.data._M_elems[9]._1_3_ = 0;
          local_238.exp = 0;
          local_238.neg = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_238,this_00,&local_98);
          local_1b8.data._M_elems._32_5_ = local_238.data._M_elems._32_5_;
          local_1b8.data._M_elems[9]._1_3_ = local_238.data._M_elems[9]._1_3_;
          local_1b8.data._M_elems[5] = local_238.data._M_elems[5];
          local_1b8.data._M_elems[4] = local_238.data._M_elems[4];
          local_1b8.data._M_elems._24_5_ =
               SUB85(CONCAT44(local_238.data._M_elems[7],local_238.data._M_elems[6]),0);
          local_1b8.data._M_elems[7]._1_3_ = (undefined3)(local_238.data._M_elems[7] >> 8);
          local_1b8.data._M_elems[0] = local_238.data._M_elems[0];
          local_1b8.data._M_elems[1] = local_238.data._M_elems[1];
          local_1b8.data._M_elems[2] = local_238.data._M_elems[2];
          local_1b8.data._M_elems[3] = local_238.data._M_elems[3];
          local_1b8.exp = local_238.exp;
          local_1b8.neg = local_238.neg;
          local_1b8.fpclass = local_238.fpclass;
          local_1b8.prec_elem = local_238.prec_elem;
          uVar4 = local_1b8._48_8_;
          pBVar3 = (this->breakpoints).data.
                   super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pBVar3[*local_200].idx = iVar7;
          iVar7 = *local_200;
          pBVar3[iVar7].src = src;
          *(undefined8 *)&pBVar3[iVar7].val.m_backend = local_238.data._M_elems._0_8_;
          *(undefined8 *)((long)&pBVar3[iVar7].val.m_backend + 8) = local_238.data._M_elems._8_8_;
          puVar2 = (uint *)((long)&pBVar3[iVar7].val.m_backend + 0x10);
          *(undefined8 *)puVar2 = local_1b8.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
          *(ulong *)((long)&pBVar3[iVar7].val.m_backend + 0x20) =
               CONCAT35(local_238.data._M_elems[9]._1_3_,local_238.data._M_elems._32_5_);
          *(int *)((long)&pBVar3[iVar7].val.m_backend + 0x28) = local_238.exp;
          *(bool *)((long)&pBVar3[iVar7].val.m_backend + 0x2c) = local_238.neg;
          *(undefined8 *)((long)&pBVar3[iVar7].val.m_backend + 0x30) = local_238._48_8_;
          local_1b8.fpclass = local_238.fpclass;
          bVar10 = local_1b8.fpclass != cpp_dec_float_NaN;
          local_1b8._48_8_ = uVar4;
          if (((bVar10) && (local_178.fpclass != cpp_dec_float_NaN)) &&
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_1b8,&local_178), iVar7 < 0)) {
            local_178.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
            local_178.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
            local_178.data._M_elems[4] = local_1b8.data._M_elems[4];
            local_178.data._M_elems[5] = local_1b8.data._M_elems[5];
            local_178.data._M_elems[6] = local_1b8.data._M_elems[6];
            local_178.data._M_elems[7] =
                 (uint)(CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_) >>
                       0x20);
            local_178.data._M_elems[0] = local_1b8.data._M_elems[0];
            local_178.data._M_elems[1] = local_1b8.data._M_elems[1];
            local_178.data._M_elems[2] = local_1b8.data._M_elems[2];
            local_178.data._M_elems[3] = local_1b8.data._M_elems[3];
            local_178.exp = local_1b8.exp;
            local_178.neg = local_1b8.neg;
            local_178.fpclass = local_1b8.fpclass;
            local_178.prec_elem = local_1b8.prec_elem;
            *local_f8 = *local_200;
          }
          *local_200 = *local_200 + 1;
        }
      }
      if ((int)((ulong)((long)(this->breakpoints).data.
                              super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->breakpoints).data.
                             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6) <= *local_200) {
        std::
        vector<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
        ::resize(&local_a8->data,(long)*local_200 * 2);
      }
      idx = idx + 1;
    } while (idx < local_a0);
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMax(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? this->fastDelta / x : (y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];
            curVal = (y >= 0) ? -this->fastDelta / x : (y - this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}